

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib508.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  char *local_38;
  WriteThis pooh;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  pooh.sizeleft._4_4_ = 0;
  local_38 = data;
  pooh.readptr = (char *)strlen(data);
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      fprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x2712,URL);
      if ((((pooh.sizeleft._4_4_ == 0) &&
           (pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x2f,1), pooh.sizeleft._4_4_ == 0)) &&
          (pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x3c,pooh.readptr), pooh.sizeleft._4_4_ == 0
          )) && (((pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x4e2c,read_callback),
                  pooh.sizeleft._4_4_ == 0 &&
                  (pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x2719,&local_38),
                  pooh.sizeleft._4_4_ == 0)) &&
                 ((pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x29,1), pooh.sizeleft._4_4_ == 0 &&
                  (pooh.sizeleft._4_4_ = curl_easy_setopt(lVar2,0x2a,1), pooh.sizeleft._4_4_ == 0)))
                 ))) {
        pooh.sizeleft._4_4_ = curl_easy_perform(lVar2);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = pooh.sizeleft._4_4_;
    }
  }
  else {
    fprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res=CURLE_OK;

  struct WriteThis pooh;

  pooh.readptr = data;
  pooh.sizeleft = strlen(data);

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now specify we want to POST data */
  test_setopt(curl, CURLOPT_POST, 1L);

#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif

  /* Set the expected POST size */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)pooh.sizeleft);

  /* we want to use our own read function */
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* pointer to pass to our read function */
  test_setopt(curl, CURLOPT_INFILE, &pooh);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}